

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileStore.cpp
# Opt level: O3

bool __thiscall FIX::FileStore::set(FileStore *this,SEQNUM msgSeqNum,string *msg)

{
  _Base_ptr p_Var1;
  FILE *__stream;
  int iVar2;
  _Base_ptr p_Var3;
  IOException *pIVar4;
  pair<std::_Rb_tree_iterator<std::pair<const_unsigned_long,_std::pair<long,_unsigned_long>_>_>,_bool>
  pVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  iVar2 = fseek((FILE *)this->m_msgFile,0,2);
  if (iVar2 != 0) {
    pIVar4 = (IOException *)__cxa_allocate_exception(0x50);
    std::operator+(&local_50,"Cannot seek to end of ",&this->m_msgFileName);
    IOException::IOException(pIVar4,&local_50);
    __cxa_throw(pIVar4,&IOException::typeinfo,FIX::Exception::~Exception);
  }
  iVar2 = fseek((FILE *)this->m_headerFile,0,2);
  if (iVar2 != 0) {
    pIVar4 = (IOException *)__cxa_allocate_exception(0x50);
    std::operator+(&local_50,"Cannot seek to end of ",&this->m_headerFileName);
    IOException::IOException(pIVar4,&local_50);
    __cxa_throw(pIVar4,&IOException::typeinfo,FIX::Exception::~Exception);
  }
  p_Var3 = (_Base_ptr)ftell((FILE *)this->m_msgFile);
  if ((long)p_Var3 < 0) {
    pIVar4 = (IOException *)__cxa_allocate_exception(0x50);
    std::operator+(&local_50,"Unable to get file pointer position from ",&this->m_msgFileName);
    IOException::IOException(pIVar4,&local_50);
    __cxa_throw(pIVar4,&IOException::typeinfo,FIX::Exception::~Exception);
  }
  p_Var1 = (_Base_ptr)msg->_M_string_length;
  iVar2 = fprintf((FILE *)this->m_headerFile,"%lu,%ld,%zu ",msgSeqNum,p_Var3,p_Var1);
  if (-1 < iVar2) {
    local_50._M_dataplus._M_p = (pointer)msgSeqNum;
    local_50._M_string_length = (size_type)p_Var3;
    local_50.field_2._M_allocated_capacity = (size_type)p_Var1;
    pVar5 = std::
            _Rb_tree<unsigned_long,std::pair<unsigned_long_const,std::pair<long,unsigned_long>>,std::_Select1st<std::pair<unsigned_long_const,std::pair<long,unsigned_long>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::pair<long,unsigned_long>>>>
            ::_M_insert_unique<std::pair<unsigned_long_const,std::pair<long,unsigned_long>>>
                      ((_Rb_tree<unsigned_long,std::pair<unsigned_long_const,std::pair<long,unsigned_long>>,std::_Select1st<std::pair<unsigned_long_const,std::pair<long,unsigned_long>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::pair<long,unsigned_long>>>>
                        *)&this->m_offsets,
                       (pair<const_unsigned_long,_std::pair<long,_unsigned_long>_> *)&local_50);
    if (((undefined1  [16])pVar5 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      pVar5.first._M_node._M_node[1]._M_parent = p_Var3;
      pVar5.first._M_node._M_node[1]._M_left = p_Var1;
    }
    fwrite((msg->_M_dataplus)._M_p,1,msg->_M_string_length,(FILE *)this->m_msgFile);
    __stream = (FILE *)this->m_msgFile;
    iVar2 = ferror(__stream);
    if (iVar2 != 0) {
      pIVar4 = (IOException *)__cxa_allocate_exception(0x50);
      std::operator+(&local_50,"Unable to write to file ",&this->m_msgFileName);
      IOException::IOException(pIVar4,&local_50);
      __cxa_throw(pIVar4,&IOException::typeinfo,FIX::Exception::~Exception);
    }
    iVar2 = fflush(__stream);
    if (iVar2 == -1) {
      pIVar4 = (IOException *)__cxa_allocate_exception(0x50);
      std::operator+(&local_50,"Unable to flush file ",&this->m_msgFileName);
      IOException::IOException(pIVar4,&local_50);
      __cxa_throw(pIVar4,&IOException::typeinfo,FIX::Exception::~Exception);
    }
    iVar2 = fflush((FILE *)this->m_headerFile);
    if (iVar2 != -1) {
      return true;
    }
    pIVar4 = (IOException *)__cxa_allocate_exception(0x50);
    std::operator+(&local_50,"Unable to flush file ",&this->m_headerFileName);
    IOException::IOException(pIVar4,&local_50);
    __cxa_throw(pIVar4,&IOException::typeinfo,FIX::Exception::~Exception);
  }
  pIVar4 = (IOException *)__cxa_allocate_exception(0x50);
  std::operator+(&local_50,"Unable to write to file ",&this->m_headerFileName);
  IOException::IOException(pIVar4,&local_50);
  __cxa_throw(pIVar4,&IOException::typeinfo,FIX::Exception::~Exception);
}

Assistant:

EXCEPT(IOException) {
  if (fseek(m_msgFile, 0, SEEK_END)) {
    throw IOException("Cannot seek to end of " + m_msgFileName);
  }
  if (fseek(m_headerFile, 0, SEEK_END)) {
    throw IOException("Cannot seek to end of " + m_headerFileName);
  }

  long offset = ftell(m_msgFile);
  if (offset < 0) {
    throw IOException("Unable to get file pointer position from " + m_msgFileName);
  }
  std::size_t size = msg.size();

  if (fprintf(m_headerFile, "%" SCNu64 ",%ld,%zu ", msgSeqNum, offset, size) < 0) {
    throw IOException("Unable to write to file " + m_headerFileName);
  }
  std::pair<NumToOffset::iterator, bool> it
      = m_offsets.insert(NumToOffset::value_type(msgSeqNum, std::make_pair(offset, size)));
  if (it.second == false) {
    it.first->second = std::make_pair(offset, size);
  }
  fwrite(msg.c_str(), sizeof(char), msg.size(), m_msgFile);
  if (ferror(m_msgFile)) {
    throw IOException("Unable to write to file " + m_msgFileName);
  }
  if (fflush(m_msgFile) == EOF) {
    throw IOException("Unable to flush file " + m_msgFileName);
  }
  if (fflush(m_headerFile) == EOF) {
    throw IOException("Unable to flush file " + m_headerFileName);
  }
  return true;
}